

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitIdentifier(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  char cVar1;
  AsmJsFunc *pAVar2;
  anon_union_8_3_a2f2c9fd_for_mConstInitialiser aVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Types TVar9;
  RegSlot value;
  undefined4 *puVar10;
  IdentPtr name;
  AsmJsSymbol *sym;
  AsmJsVarBase *pAVar11;
  AsmJsVar *pAVar12;
  AsmJsMathConst *pAVar13;
  RegisterSpace *pRVar14;
  AsmJsCompilationException *this_00;
  int32 i32y;
  RegSlot R1;
  ulong uVar15;
  long lVar16;
  long lVar17;
  OpCodeAsmJs OVar18;
  AsmJsByteCodeWriter *this_01;
  uint32 slotId;
  long i64;
  long i64_1;
  ulong uVar19;
  RegSlot *pRVar20;
  long lVar21;
  double dVar22;
  AsmJsType local_48;
  Source local_44;
  float fStack_40;
  Source source;
  RegSlot local_34;
  
  if ((pnode->nop != knopName) && (pnode->nop != knopStr)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x575,"(ParserWrapper::IsNameDeclaration( pnode ))",
                                "ParserWrapper::IsNameDeclaration( pnode )");
    if (!bVar5) goto LAB_009386f7;
    *puVar10 = 0;
  }
  name = ParseNode::name(pnode);
  sym = AsmJsModuleCompiler::LookupIdentifier(this->mCompiler,name,this->mFunction,&local_44);
  if (sym == (AsmJsSymbol *)0x0) {
    this_00 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_00,L"Undefined identifier %s",&name->field_0x22);
LAB_009386e6:
    __cxa_throw(this_00,&AsmJsCompilationException::typeinfo,0);
  }
  switch(sym->mType) {
  case Variable:
    break;
  case Argument:
  case ConstantImport:
    goto switchD_00938008_caseD_1;
  case MathConstant:
    pAVar13 = AsmJsMathConst::FromSymbol(sym);
    local_48.which_ = (**(pAVar13->super_AsmJsSymbol)._vptr_AsmJsSymbol)(pAVar13);
    bVar5 = AsmJsType::isDouble(&local_48);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x5c3,"(mathConst->GetType().isDouble())",
                                  "mathConst->GetType().isDouble()");
      if (!bVar5) goto LAB_009386f7;
      *puVar10 = 0;
    }
    pAVar2 = this->mFunction;
    TVar9 = WAsmJs::FromPrimitiveType<double>();
    pRVar14 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar2->mTypedRegisterAllocator,TVar9);
    local_34 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar14);
    dVar22 = *pAVar13->mVal;
    pAVar2 = this->mFunction;
    _fStack_40 = &this->mWriter;
    TVar9 = WAsmJs::FromPrimitiveType<double>();
    pRVar14 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar2->mTypedRegisterAllocator,TVar9);
    lVar17 = *(long *)&pRVar14[1].mFirstTmpReg;
    uVar8 = 0;
    if (lVar17 != 0) {
      uVar8 = JsUtil::
              BaseDictionary<double,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetBucket(((uint)((ulong)dVar22 >> 0x20) ^ SUB84(dVar22,0)) * 2 + 1,
                          pRVar14[2].mNbConst,pRVar14[3].mNextLocation);
      uVar6 = *(uint *)(lVar17 + (ulong)uVar8 * 4);
      uVar8 = 0;
      if (-1 < (int)uVar6) {
        lVar17 = *(long *)&pRVar14[1].mNbConst;
        uVar8 = 0;
        do {
          lVar16 = (ulong)uVar6 * 0x10;
          if (*(double *)(lVar17 + 8 + lVar16) == dVar22) {
            if (*(DictionaryStats **)&pRVar14[3].mNbConst != (DictionaryStats *)0x0) {
              DictionaryStats::Lookup(*(DictionaryStats **)&pRVar14[3].mNbConst,uVar8);
              lVar17._0_4_ = pRVar14[1].mNbConst;
              lVar17._4_4_ = pRVar14[1].mType;
            }
            pRVar20 = (RegSlot *)(lVar17 + lVar16);
            goto LAB_0093844c;
          }
          uVar8 = uVar8 + 1;
          uVar6 = *(uint *)(lVar16 + lVar17 + 4);
        } while (-1 < (int)uVar6);
      }
    }
    pRVar20 = &Constants::NoRegister;
    if (*(DictionaryStats **)&pRVar14[3].mNbConst != (DictionaryStats *)0x0) {
      DictionaryStats::Lookup(*(DictionaryStats **)&pRVar14[3].mNbConst,uVar8);
    }
LAB_0093844c:
    value = local_34;
    AsmJsByteCodeWriter::AsmReg2(_fStack_40,Ld_Db,local_34,*pRVar20);
    uVar19 = 2;
    goto LAB_009386a8;
  default:
    this_00 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_00,L"Cannot use identifier %s in this context",&name->field_0x22);
    goto LAB_009386e6;
  }
  pAVar12 = AsmJsVar::FromSymbol(sym);
  iVar7 = (*(pAVar12->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol[1])(pAVar12);
  if ((char)iVar7 == '\0') {
    if (local_44 != AsmJsModule) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x586,"(source == AsmJsLookupSource::AsmJsModule)",
                                  "source == AsmJsLookupSource::AsmJsModule");
      if (!bVar5) goto LAB_009386f7;
      *puVar10 = 0;
    }
    uVar6 = (**(pAVar12->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol)(pAVar12);
    uVar19 = (ulong)uVar6;
    cVar1 = (pAVar12->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14;
    if (cVar1 == '\x03') {
      pAVar2 = this->mFunction;
      TVar9 = WAsmJs::FromPrimitiveType<float>();
      pRVar14 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&pAVar2->mTypedRegisterAllocator,TVar9);
      local_34 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar14);
      _fStack_40 = (AsmJsByteCodeWriter *)CONCAT44(source,(pAVar12->mConstInitialiser).intVal);
      pAVar2 = this->mFunction;
      this_01 = &this->mWriter;
      TVar9 = WAsmJs::FromPrimitiveType<float>();
      pRVar14 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&pAVar2->mTypedRegisterAllocator,TVar9);
      lVar17 = *(long *)&pRVar14[1].mFirstTmpReg;
      uVar8 = 0;
      if (lVar17 != 0) {
        uVar8 = JsUtil::
                BaseDictionary<float,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetBucket((int)(long)fStack_40 * 2 + 1,pRVar14[2].mNbConst,
                            pRVar14[3].mNextLocation);
        uVar6 = *(uint *)(lVar17 + (ulong)uVar8 * 4);
        uVar8 = 0;
        if (-1 < (int)uVar6) {
          lVar16 = *(long *)&pRVar14[1].mNbConst;
          uVar8 = 0;
          do {
            uVar15 = (ulong)uVar6;
            if ((float)*(int *)(lVar16 + 8 + uVar15 * 0xc) == fStack_40) {
              if (*(DictionaryStats **)&pRVar14[3].mNbConst != (DictionaryStats *)0x0) {
                DictionaryStats::Lookup(*(DictionaryStats **)&pRVar14[3].mNbConst,uVar8);
                lVar16._0_4_ = pRVar14[1].mNbConst;
                lVar16._4_4_ = pRVar14[1].mType;
              }
              pRVar20 = (RegSlot *)(lVar16 + uVar15 * 0xc);
              goto LAB_00938692;
            }
            uVar8 = uVar8 + 1;
            uVar6 = *(uint *)(lVar16 + uVar15 * 0xc + 4);
          } while (-1 < (int)uVar6);
        }
      }
      pRVar20 = &Constants::NoRegister;
      if (*(DictionaryStats **)&pRVar14[3].mNbConst != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(*(DictionaryStats **)&pRVar14[3].mNbConst,uVar8);
      }
LAB_00938692:
      R1 = *pRVar20;
      OVar18 = Ld_Flt;
    }
    else {
      if (cVar1 != '\x02') {
        if (cVar1 == '\0') {
          pAVar2 = this->mFunction;
          TVar9 = WAsmJs::FromPrimitiveType<int>();
          pRVar14 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                              (&pAVar2->mTypedRegisterAllocator,TVar9);
          value = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar14);
          AsmJsByteCodeWriter::AsmInt1Const1
                    (&this->mWriter,Ld_IntConst,value,(pAVar12->mConstInitialiser).intVal);
          goto LAB_009386a8;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x595,"(var->GetVarType().isDouble())",
                                    "var->GetVarType().isDouble()");
        if (!bVar5) goto LAB_009386f7;
        *puVar10 = 0;
      }
      pAVar2 = this->mFunction;
      TVar9 = WAsmJs::FromPrimitiveType<double>();
      pRVar14 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&pAVar2->mTypedRegisterAllocator,TVar9);
      local_34 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar14);
      aVar3 = pAVar12->mConstInitialiser;
      pAVar2 = this->mFunction;
      _fStack_40 = &this->mWriter;
      TVar9 = WAsmJs::FromPrimitiveType<double>();
      pRVar14 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&pAVar2->mTypedRegisterAllocator,TVar9);
      lVar17 = *(long *)&pRVar14[1].mFirstTmpReg;
      uVar8 = 0;
      if (lVar17 != 0) {
        uVar8 = JsUtil::
                BaseDictionary<double,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetBucket((aVar3._4_4_ ^ aVar3.intVal) * 2 + 1,pRVar14[2].mNbConst,
                            pRVar14[3].mNextLocation);
        uVar6 = *(uint *)(lVar17 + (ulong)uVar8 * 4);
        uVar8 = 0;
        if (-1 < (int)uVar6) {
          lVar21 = *(long *)&pRVar14[1].mNbConst;
          uVar8 = 0;
          do {
            lVar17 = (ulong)uVar6 * 0x10;
            if (*(anon_union_8_3_a2f2c9fd_for_mConstInitialiser *)(lVar21 + 8 + lVar17) == aVar3) {
              if (*(DictionaryStats **)&pRVar14[3].mNbConst != (DictionaryStats *)0x0) {
                DictionaryStats::Lookup(*(DictionaryStats **)&pRVar14[3].mNbConst,uVar8);
                lVar21._0_4_ = pRVar14[1].mNbConst;
                lVar21._4_4_ = pRVar14[1].mType;
              }
              pRVar20 = (RegSlot *)(lVar21 + lVar17);
              goto LAB_00938669;
            }
            uVar8 = uVar8 + 1;
            uVar6 = *(uint *)(lVar17 + lVar21 + 4);
          } while (-1 < (int)uVar6);
        }
      }
      pRVar20 = &Constants::NoRegister;
      if (*(DictionaryStats **)&pRVar14[3].mNbConst != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(*(DictionaryStats **)&pRVar14[3].mNbConst,uVar8);
      }
LAB_00938669:
      R1 = *pRVar20;
      OVar18 = Ld_Db;
      this_01 = _fStack_40;
    }
    value = local_34;
    AsmJsByteCodeWriter::AsmReg2(this_01,OVar18,local_34,R1);
    goto LAB_009386a8;
  }
switchD_00938008_caseD_1:
  pAVar11 = AsmJsVarBase::FromSymbol(sym);
  if (local_44 != AsmJsModule) {
    if (local_44 == AsmJsFunction) {
      value = pAVar11->mLocation;
      uVar6 = (**(pAVar11->super_AsmJsSymbol)._vptr_AsmJsSymbol)(pAVar11);
      uVar19 = (ulong)uVar6;
      goto LAB_009386a8;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x5a7,"(source == AsmJsLookupSource::AsmJsModule)",
                                "source == AsmJsLookupSource::AsmJsModule");
    if (!bVar5) goto LAB_009386f7;
    *puVar10 = 0;
  }
  uVar6 = (**(pAVar11->super_AsmJsSymbol)._vptr_AsmJsSymbol)(pAVar11);
  uVar19 = (ulong)uVar6;
  cVar1 = (pAVar11->super_AsmJsSymbol).field_0x14;
  if (cVar1 == '\x03') {
    pAVar2 = this->mFunction;
    TVar9 = WAsmJs::FromPrimitiveType<float>();
    pRVar14 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar2->mTypedRegisterAllocator,TVar9);
    value = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar14);
    dVar22 = (double)(this->mCompiler->mModuleMemory).mFloatOffset;
    slotId = (int)(dVar22 + dVar22 + 0.5) + pAVar11->mLocation;
    OVar18 = LdSlot_Flt;
  }
  else if (cVar1 == '\x02') {
    pAVar2 = this->mFunction;
    TVar9 = WAsmJs::FromPrimitiveType<double>();
    pRVar14 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar2->mTypedRegisterAllocator,TVar9);
    value = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar14);
    slotId = (this->mCompiler->mModuleMemory).mDoubleOffset + pAVar11->mLocation;
    OVar18 = LdSlot_Db;
  }
  else {
    if (cVar1 != '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x5ba,"((0))","UNREACHED");
      if (!bVar5) {
LAB_009386f7:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar10 = 0;
      value = 0xffffffff;
      goto LAB_009386a8;
    }
    pAVar2 = this->mFunction;
    TVar9 = WAsmJs::FromPrimitiveType<int>();
    pRVar14 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar2->mTypedRegisterAllocator,TVar9);
    value = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar14);
    dVar22 = (double)(this->mCompiler->mModuleMemory).mIntOffset;
    slotId = (int)(dVar22 + dVar22 + 0.5) + pAVar11->mLocation;
    OVar18 = LdSlot_Int;
  }
  AsmJsByteCodeWriter::AsmSlot(&this->mWriter,OVar18,value,1,slotId);
LAB_009386a8:
  return (EmitExpressionInfo)((ulong)value | uVar19 << 0x20);
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitIdentifier( ParseNode * pnode )
    {
        Assert( ParserWrapper::IsNameDeclaration( pnode ) );
        PropertyName name = pnode->name();
        AsmJsLookupSource::Source source;
        AsmJsSymbol* sym = mCompiler->LookupIdentifier( name, mFunction, &source );
        if( !sym )
        {
            throw AsmJsCompilationException( _u("Undefined identifier %s"), name->Psz() );
        }

        switch( sym->GetSymbolType() )
        {
        case AsmJsSymbol::Variable:
        {
            AsmJsVar * var = AsmJsVar::FromSymbol(sym);
            if (!var->isMutable())
            {
                // currently const is only allowed for variables at module scope
                Assert(source == AsmJsLookupSource::AsmJsModule);

                EmitExpressionInfo emitInfo(var->GetType());
                if (var->GetVarType().isInt())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<int>();
                    mWriter.AsmInt1Const1(Js::OpCodeAsmJs::Ld_IntConst, emitInfo.location, var->GetIntInitialiser());
                }
                else if (var->GetVarType().isFloat())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<float>();
                    mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Flt, emitInfo.location, mFunction->GetConstRegister<float>(var->GetFloatInitialiser()));
                }
                else
                {
                    Assert(var->GetVarType().isDouble());
                    emitInfo.location = mFunction->AcquireTmpRegister<double>();
                    mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Db, emitInfo.location, mFunction->GetConstRegister<double>(var->GetDoubleInitialiser()));
                }
                return emitInfo;
            }
            // else fall through
        }
        case AsmJsSymbol::Argument:
        case AsmJsSymbol::ConstantImport:
        {
            AsmJsVarBase* var = AsmJsVarBase::FromSymbol(sym);
            if( source == AsmJsLookupSource::AsmJsFunction )
            {
                return EmitExpressionInfo( var->GetLocation(), var->GetType() );
            }
            else
            {
                Assert( source == AsmJsLookupSource::AsmJsModule );
                EmitExpressionInfo emitInfo(var->GetType());
                if (var->GetVarType().isInt())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<int>();
                    LoadModuleInt(emitInfo.location, var->GetLocation());
                }
                else if (var->GetVarType().isFloat())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<float>();
                    LoadModuleFloat(emitInfo.location, var->GetLocation());
                }
                else if (var->GetVarType().isDouble())
                {
                    emitInfo.location = mFunction->AcquireTmpRegister<double>();
                    LoadModuleDouble(emitInfo.location, var->GetLocation());
                }
                else
                {
                    Assert(UNREACHED);
                }
                return emitInfo;
            }
            break;
        }
        case AsmJsSymbol::MathConstant:
        {
            AsmJsMathConst* mathConst = AsmJsMathConst::FromSymbol(sym);
            Assert(mathConst->GetType().isDouble());
            RegSlot loc = mFunction->AcquireTmpRegister<double>();
            mWriter.AsmReg2( OpCodeAsmJs::Ld_Db, loc, mFunction->GetConstRegister<double>(*mathConst->GetVal()) );
            return EmitExpressionInfo(loc, AsmJsType::Double);
        }

        case AsmJsSymbol::ImportFunction:
        case AsmJsSymbol::FuncPtrTable:
        case AsmJsSymbol::ModuleFunction:
        case AsmJsSymbol::ArrayView:
        case AsmJsSymbol::MathBuiltinFunction:
        default:
            throw AsmJsCompilationException( _u("Cannot use identifier %s in this context"), name->Psz() );
        }
    }